

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controller.cpp
# Opt level: O3

void __thiscall
hbm::streaming::Controller::Controller
          (Controller *this,string *streamId,string *address,string *port,string *path)

{
  pointer pcVar1;
  runtime_error *this_00;
  
  (this->m_streamId)._M_dataplus._M_p = (pointer)&(this->m_streamId).field_2;
  pcVar1 = (streamId->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + streamId->_M_string_length);
  HttpPost::HttpPost(&this->m_httpPost,address,port,path);
  if ((this->m_streamId)._M_string_length != 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"no stream id provided");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Controller::Controller(const std::string& streamId, const std::string& address, const std::string& port, const std::string& path)
			: m_streamId(streamId)
			, m_httpPost(address, port, path)
		{
			if(m_streamId.empty()) {
				throw std::runtime_error("no stream id provided");
			}
		}